

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::deinit
          (TessellationShaderTessellationgl_TessCoord *this)

{
  TessellationShaderUtils *this_00;
  bool bVar1;
  ContextType CVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference test;
  __normal_iterator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor_*,_std::vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>_>
  local_48;
  __normal_iterator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor_*,_std::vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>_>
  local_40;
  iterator it;
  float default_tess_levels [4];
  Functions *gl;
  TessellationShaderTessellationgl_TessCoord *this_local;
  long lVar5;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    CVar2.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(CVar2);
    if ((!bVar1) || (this->m_test_type != TESSELLATION_TEST_TYPE_TES)) {
      pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
      iVar3 = (*pRVar4->_vptr_RenderContext[3])();
      lVar5 = CONCAT44(extraout_var,iVar3);
      (**(code **)(lVar5 + 0x40))(0x8c8e,0);
      (**(code **)(lVar5 + 0x48))(0x8c8e,0);
      (**(code **)(lVar5 + 0x4e8))(0x8c89);
      pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
      CVar2.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
      bVar1 = glu::isContextTypeES(CVar2);
      if (!bVar1) {
        it._M_current = (_test_descriptor *)0x3f8000003f800000;
        (**(code **)(lVar5 + 0xfd0))(0x8e73,&it);
        (**(code **)(lVar5 + 0xfd0))(0x8e74,&it);
      }
      (**(code **)(lVar5 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
      (**(code **)(lVar5 + 0xd8))(0);
      if (this->m_bo_id != 0) {
        (**(code **)(lVar5 + 0x438))(1,&this->m_bo_id);
        this->m_bo_id = 0;
      }
      if (this->m_broken_ts_id != 0) {
        (**(code **)(lVar5 + 0x470))(this->m_broken_ts_id);
        this->m_broken_ts_id = 0;
      }
      if (this->m_fs_id != 0) {
        (**(code **)(lVar5 + 0x470))(this->m_fs_id);
        this->m_fs_id = 0;
      }
      if (this->m_vs_id != 0) {
        (**(code **)(lVar5 + 0x470))(this->m_vs_id);
        this->m_vs_id = 0;
      }
      if (this->m_vao_id != 0) {
        (**(code **)(lVar5 + 0x490))(1,&this->m_vao_id);
        this->m_vao_id = 0;
      }
      local_40._M_current =
           (_test_descriptor *)
           std::
           vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
           ::begin(&this->m_tests);
      while( true ) {
        local_48._M_current =
             (_test_descriptor *)
             std::
             vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
             ::end(&this->m_tests);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
        if (!bVar1) break;
        test = __gnu_cxx::
               __normal_iterator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor_*,_std::vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>_>
               ::operator*(&local_40);
        deinitTestDescriptor(this,test);
        __gnu_cxx::
        __normal_iterator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor_*,_std::vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>_>
        ::operator++(&local_40);
      }
      std::
      vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
      ::clear(&this->m_tests);
      if (this->m_utils_ptr != (TessellationShaderUtils *)0x0) {
        this_00 = this->m_utils_ptr;
        if (this_00 != (TessellationShaderUtils *)0x0) {
          TessellationShaderUtils::~TessellationShaderUtils(this_00);
          operator_delete(this_00,0x20);
        }
        this->m_utils_ptr = (TessellationShaderUtils *)0x0;
      }
    }
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	if (glu::isContextTypeES(m_context.getRenderContext().getType()) && m_test_type == TESSELLATION_TEST_TYPE_TES)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Revert buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Restore GL_PATCH_VERTICES_EXT, GL_PATCH_DEFAULT_INNER_LEVEL and
	 * GL_PATCH_DEFAULT_OUTER_LEVEL values */
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		const float default_tess_levels[] = { 1.0f, 1.0f, 1.0f, 1.0f };
		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, default_tess_levels);
		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, default_tess_levels);
	}
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Free all ES objects we allocated for the test */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_broken_ts_id != 0)
	{
		gl.deleteShader(m_broken_ts_id);

		m_broken_ts_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Deinitialize all test descriptors */
	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(*it);
	}
	m_tests.clear();

	/* Release tessellation shader test utilities instance */
	if (m_utils_ptr != NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = NULL;
	}
}